

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__cff_get_index(stbtt__buf *b)

{
  byte bVar1;
  stbtt_uint32 sVar2;
  uint n;
  stbtt__buf *in_RDI;
  stbtt__buf sVar3;
  int offsize;
  int start;
  int count;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  stbtt__buf *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar4 = in_RDI->cursor;
  sVar2 = stbtt__buf_get((stbtt__buf *)CONCAT44(in_stack_ffffffffffffffe4,iVar4),
                         in_stack_ffffffffffffffdc);
  if (sVar2 != 0) {
    bVar1 = stbtt__buf_get8(in_RDI);
    n = (uint)bVar1;
    if (n == 0 || 4 < n) {
      __assert_fail("offsize >= 1 && offsize <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                    ,0x49c,"stbtt__buf stbtt__cff_get_index(stbtt__buf *)");
    }
    stbtt__buf_skip(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    stbtt__buf_get((stbtt__buf *)CONCAT44(sVar2,iVar4),n);
    stbtt__buf_skip(in_RDI,in_stack_ffffffffffffffcc);
    in_stack_ffffffffffffffd0 = in_RDI;
  }
  sVar3 = stbtt__buf_range(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                           in_stack_ffffffffffffffc8);
  return sVar3;
}

Assistant:

static stbtt__buf stbtt__cff_get_index(stbtt__buf *b)
{
   int count, start, offsize;
   start = b->cursor;
   count = stbtt__buf_get16(b);
   if (count) {
      offsize = stbtt__buf_get8(b);
      STBTT_assert(offsize >= 1 && offsize <= 4);
      stbtt__buf_skip(b, offsize * count);
      stbtt__buf_skip(b, stbtt__buf_get(b, offsize) - 1);
   }
   return stbtt__buf_range(b, start, b->cursor - start);
}